

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O0

_Bool parse_dash_array(element_t *element,int id,stroke_dash_array_t *dash_array)

{
  _Bool _Var1;
  char *end_00;
  bool bVar2;
  char *end;
  char *it;
  string_t *value;
  stroke_dash_array_t *dash_array_local;
  element_t *peStack_18;
  int id_local;
  element_t *element_local;
  
  value = (string_t *)dash_array;
  dash_array_local._4_4_ = id;
  peStack_18 = element;
  it = (char *)find_attribute(element,id,true);
  if ((string_t *)it != (string_t *)0x0) {
    end = ((string_t *)it)->data;
    end_00 = end + ((string_t *)it)->length;
    while( true ) {
      bVar2 = false;
      if (end < end_00) {
        bVar2 = value[0x40].data < (char *)0x80;
      }
      if (!bVar2) {
        return true;
      }
      _Var1 = parse_length_value(&end,end_00,(length_t *)(&value->data + (long)value[0x40].data),
                                 false);
      if (!_Var1) break;
      skip_ws_comma(&end,end_00);
      value[0x40].data = value[0x40].data + 1;
    }
  }
  return false;
}

Assistant:

static bool parse_dash_array(const element_t* element, int id, stroke_dash_array_t* dash_array)
{
    const string_t* value = find_attribute(element, id, true);
    if(value == NULL)
        return false;
    const char* it = value->data;
    const char* end = it + value->length;
    while(it < end && dash_array->size < MAX_DASHES) {
        if(!parse_length_value(&it, end, dash_array->data + dash_array->size, false))
            return false;
        skip_ws_comma(&it, end);
        dash_array->size += 1;
    }

    return true;
}